

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

BufferVkImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::BufferVkImpl,Diligent::FixedBlockMemoryAllocator>::operator()
          (MakeNewRCObj<Diligent::BufferVkImpl,Diligent::FixedBlockMemoryAllocator> *this,
          FixedBlockMemoryAllocator *CtorArgs,RenderDeviceVkImpl **CtorArgs_1,BufferDesc *CtorArgs_2
          ,BufferData **CtorArgs_3)

{
  FixedBlockMemoryAllocator *pFVar1;
  BufferVkImpl *local_48;
  BufferVkImpl *pObj;
  IReferenceCounters *pRefCounters;
  RefCountersImpl *pNewRefCounters;
  BufferData **CtorArgs_local_3;
  BufferDesc *CtorArgs_local_2;
  RenderDeviceVkImpl **CtorArgs_local_1;
  FixedBlockMemoryAllocator *CtorArgs_local;
  MakeNewRCObj<Diligent::BufferVkImpl,_Diligent::FixedBlockMemoryAllocator> *this_local;
  
  pRefCounters = (IReferenceCounters *)0x0;
  pFVar1 = CtorArgs;
  if (*(long *)(this + 8) == 0) {
    pObj = (BufferVkImpl *)::operator_new(0x30);
    RefCountersImpl::RefCountersImpl((RefCountersImpl *)pObj);
    pRefCounters = (IReferenceCounters *)pObj;
  }
  else {
    pObj = (BufferVkImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
  }
  if (*(long *)this == 0) {
    local_48 = (BufferVkImpl *)
               RefCountedObject<Diligent::IBufferVk>::operator_new
                         ((RefCountedObject<Diligent::IBufferVk> *)0xc8,(size_t)pFVar1);
    BufferVkImpl::BufferVkImpl
              (local_48,(IReferenceCounters *)pObj,CtorArgs,*CtorArgs_1,CtorArgs_2,*CtorArgs_3);
  }
  else {
    local_48 = (BufferVkImpl *)
               ::new<Diligent::FixedBlockMemoryAllocator>
                         (200,*(FixedBlockMemoryAllocator **)this,*(Char **)(this + 0x10),
                          *(char **)(this + 0x18),*(Int32 *)(this + 0x20));
    BufferVkImpl::BufferVkImpl
              (local_48,(IReferenceCounters *)pObj,CtorArgs,*CtorArgs_1,CtorArgs_2,*CtorArgs_3);
  }
  if (pRefCounters != (IReferenceCounters *)0x0) {
    RefCountersImpl::Attach<Diligent::BufferVkImpl,Diligent::FixedBlockMemoryAllocator>
              ((RefCountersImpl *)pRefCounters,local_48,*(FixedBlockMemoryAllocator **)this);
  }
  return local_48;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }